

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int MMDB_open(char *filename,uint32_t flags,MMDB_s *mmdb)

{
  uint16_t *puVar1;
  uint64_t *key;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  char *__file;
  int *piVar11;
  uint8_t *puVar12;
  uint16_t uVar13;
  long lVar14;
  char **value;
  uint64_t *value_00;
  ulong uVar15;
  long lVar16;
  long *plVar17;
  long *plVar18;
  ulong uVar19;
  long *plVar20;
  MMDB_entry_data_s entry_data;
  MMDB_s metadata_db;
  MMDB_entry_s local_118;
  char *local_108;
  undefined8 local_100;
  MMDB_entry_data_s local_f8;
  undefined1 local_c0 [40];
  uint32_t local_98;
  uint8_t *local_90;
  
  (mmdb->metadata).description.count = 0;
  mmdb->file_content = (uint8_t *)0x0;
  mmdb->data_section = (uint8_t *)0x0;
  (mmdb->metadata).database_type = (char *)0x0;
  (mmdb->metadata).languages.count = 0;
  (mmdb->metadata).languages.names = (char **)0x0;
  sVar10 = strlen(filename);
  __file = (char *)malloc(sVar10 + 1);
  if (__file == (char *)0x0) {
    mmdb->filename = (char *)0x0;
    uVar8 = 5;
  }
  else {
    memcpy(__file,filename,sVar10 + 1);
    mmdb->filename = __file;
    mmdb->flags = (flags & 7) == 0 | flags;
    iVar6 = open(__file,0x80000);
    if (iVar6 < 0) {
      uVar8 = 1;
    }
    else {
      iVar7 = fstat(iVar6,(stat *)local_c0);
      uVar8 = 1;
      if (iVar7 == 0) {
        if ((long)local_90 < 0) {
          uVar8 = 5;
        }
        else {
          uVar8 = 0;
          puVar12 = (uint8_t *)mmap((void *)0x0,(size_t)local_90,1,1,iVar6,0);
          if (puVar12 == (uint8_t *)0xffffffffffffffff) {
            piVar11 = __errno_location();
            uVar8 = *piVar11 == 0xc | 4;
          }
          else {
            mmdb->file_size = (ssize_t)local_90;
            mmdb->file_content = puVar12;
          }
        }
      }
      piVar11 = __errno_location();
      iVar7 = *piVar11;
      close(iVar6);
      *piVar11 = iVar7;
      if (uVar8 == 0) {
        uVar2 = mmdb->file_size;
        uVar8 = 3;
        if (-1 < (long)uVar2) {
          uVar19 = 0x20000;
          if (uVar2 < 0x20000) {
            uVar19 = uVar2;
          }
          if (0xd < uVar2) {
            uVar3 = uVar19;
            plVar18 = (long *)(mmdb->file_content + (uVar2 - uVar19));
            do {
              uVar15 = uVar3;
              plVar20 = (long *)((long)plVar18 + (uVar15 - 0xe));
              if (plVar20 < plVar18) goto LAB_00101c21;
              lVar16 = 0xe;
              plVar17 = plVar18;
              while (((char)*plVar17 != -0x55 ||
                     (*(long *)((long)plVar17 + 6) != 0x6d6f632e646e694d ||
                      *plVar17 != 0x694d78614defcdab))) {
                plVar17 = (long *)((long)plVar17 + 1);
                lVar16 = lVar16 + 1;
                if (plVar20 < plVar17) goto LAB_00101c21;
              }
              plVar18 = (long *)((long)plVar17 + 0xe);
              uVar3 = uVar15 - lVar16;
            } while (0xd < uVar15 - lVar16);
            plVar18 = (long *)((long)plVar17 + 0xe);
            uVar15 = uVar15 - lVar16;
LAB_00101c21:
            if (plVar18 != (long *)0x0 && plVar18 != (long *)(mmdb->file_content + (uVar2 - uVar19))
               ) {
              mmdb->metadata_section = (uint8_t *)plVar18;
              mmdb->metadata_section_size = (uint32_t)uVar15;
              memset((stat *)local_c0,0,0x88);
              local_118.offset = 0;
              local_108 = "node_count";
              local_100 = 0;
              local_118.mmdb = (MMDB_s *)local_c0;
              local_c0._32_8_ = plVar18;
              local_98 = (uint32_t)uVar15;
              uVar8 = MMDB_aget_value(&local_118,&local_f8,&local_108);
              if ((uVar8 == 0) && (uVar8 = 3, local_f8.type == 6)) {
                (mmdb->metadata).node_count = local_f8.field_1.pointer;
                uVar9 = 3;
                uVar8 = uVar9;
                if (local_f8.field_1.pointer != 0) {
                  puVar1 = &(mmdb->metadata).record_size;
                  uVar8 = value_for_key_as_uint16(&local_118,"record_size",puVar1);
                  if (uVar8 == 0) {
                    uVar5 = *puVar1;
                    uVar5 = uVar5 << 0xe | uVar5 >> 2;
                    if (uVar5 - 6 < 3) {
                      puVar1 = &(mmdb->metadata).ip_version;
                      uVar8 = value_for_key_as_uint16(&local_118,"ip_version",puVar1);
                      if ((((uVar8 == 0) && (uVar8 = uVar9, (*puVar1 | 2) == 6)) &&
                          (uVar8 = value_for_key_as_string
                                             (&local_118,(char *)&(mmdb->metadata).database_type,
                                              value), uVar8 == 0)) &&
                         (uVar8 = populate_languages_metadata(mmdb,(MMDB_s *)local_c0,&local_118),
                         uVar8 == 0)) {
                        puVar1 = &(mmdb->metadata).binary_format_major_version;
                        uVar8 = value_for_key_as_uint16
                                          (&local_118,"binary_format_major_version",puVar1);
                        if (((uVar8 == 0) && (uVar8 = uVar9, *puVar1 != 0)) &&
                           (uVar8 = value_for_key_as_uint16
                                              (&local_118,"binary_format_minor_version",
                                               &(mmdb->metadata).binary_format_minor_version),
                           uVar8 == 0)) {
                          key = &(mmdb->metadata).build_epoch;
                          uVar8 = value_for_key_as_uint64(&local_118,(char *)key,value_00);
                          if (((uVar8 == 0) && (uVar8 = uVar9, *key != 0)) &&
                             (uVar8 = populate_description_metadata
                                                (mmdb,(MMDB_s *)local_c0,&local_118), uVar8 == 0)) {
                            uVar5 = (mmdb->metadata).record_size >> 2;
                            mmdb->full_record_byte_size = uVar5;
                            uVar13 = 0x80;
                            if ((mmdb->metadata).ip_version == 4) {
                              uVar13 = 0x20;
                            }
                            mmdb->depth = uVar13;
                            uVar8 = 6;
                            if ((mmdb->metadata).binary_format_major_version == 2) {
                              _Var4 = can_multiply(0x7fffffffffffffff,
                                                   (ulong)(mmdb->metadata).node_count,(ulong)uVar5);
                              uVar8 = 3;
                              if (_Var4) {
                                lVar14 = (ulong)mmdb->full_record_byte_size *
                                         (ulong)(mmdb->metadata).node_count;
                                lVar16 = mmdb->file_size;
                                mmdb->data_section = mmdb->file_content + lVar14 + 0x10;
                                if (((lVar14 - (lVar16 + -0x10) == 0 || lVar14 < lVar16 + -0x10) &&
                                     0xf < lVar16) &&
                                   (0xffffffff00000000 < (lVar16 - lVar14) - 0x100000010U)) {
                                  uVar9 = (int)(lVar16 - lVar14) - 0x10;
                                  mmdb->data_section_size = uVar9;
                                  uVar8 = 7;
                                  if (2 < uVar9) {
                                    mmdb->metadata_section = (uint8_t *)plVar18;
                                    (mmdb->ipv4_start_node).node_value = 0;
                                    (mmdb->ipv4_start_node).netmask = 0;
                                    if ((mmdb->metadata).ip_version != 6) {
                                      return 0;
                                    }
                                    uVar8 = find_ipv4_start_node(mmdb);
                                    if (uVar8 == 0) {
                                      return 0;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      uVar8 = uVar9;
                      if (uVar5 != 0) {
                        uVar8 = 6;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  piVar11 = __errno_location();
  iVar6 = *piVar11;
  free_mmdb_struct(mmdb);
  *piVar11 = iVar6;
  return uVar8;
}

Assistant:

int MMDB_open(const char *const filename, uint32_t flags, MMDB_s *const mmdb) {
    int status = MMDB_SUCCESS;

    mmdb->file_content = NULL;
    mmdb->data_section = NULL;
    mmdb->metadata.database_type = NULL;
    mmdb->metadata.languages.count = 0;
    mmdb->metadata.languages.names = NULL;
    mmdb->metadata.description.count = 0;

    mmdb->filename = mmdb_strdup(filename);
    if (NULL == mmdb->filename) {
        status = MMDB_OUT_OF_MEMORY_ERROR;
        goto cleanup;
    }

    if ((flags & MMDB_MODE_MASK) == 0) {
        flags |= MMDB_MODE_MMAP;
    }
    mmdb->flags = flags;

    if (MMDB_SUCCESS != (status = map_file(mmdb))) {
        goto cleanup;
    }

#ifdef _WIN32
    WSADATA wsa;
    WSAStartup(MAKEWORD(2, 2), &wsa);
#endif

    uint32_t metadata_size = 0;
    const uint8_t *metadata =
        find_metadata(mmdb->file_content, mmdb->file_size, &metadata_size);
    if (NULL == metadata) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->metadata_section_size = metadata_size;

    status = read_metadata(mmdb);
    if (MMDB_SUCCESS != status) {
        goto cleanup;
    }

    if (mmdb->metadata.binary_format_major_version != 2) {
        status = MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
        goto cleanup;
    }

    if (!can_multiply(SSIZE_MAX,
                      mmdb->metadata.node_count,
                      mmdb->full_record_byte_size)) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t search_tree_size = (ssize_t)mmdb->metadata.node_count *
                               (ssize_t)mmdb->full_record_byte_size;

    mmdb->data_section =
        mmdb->file_content + search_tree_size + MMDB_DATA_SECTION_SEPARATOR;
    if (mmdb->file_size < MMDB_DATA_SECTION_SEPARATOR ||
        search_tree_size > mmdb->file_size - MMDB_DATA_SECTION_SEPARATOR) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t data_section_size =
        mmdb->file_size - search_tree_size - MMDB_DATA_SECTION_SEPARATOR;
    if (data_section_size > UINT32_MAX || data_section_size <= 0) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    mmdb->data_section_size = (uint32_t)data_section_size;

    // Although it is likely not possible to construct a database with valid
    // valid metadata, as parsed above, and a data_section_size less than 3,
    // we do this check as later we assume it is at least three when doing
    // bound checks.
    if (mmdb->data_section_size < 3) {
        status = MMDB_INVALID_DATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->ipv4_start_node.node_value = 0;
    mmdb->ipv4_start_node.netmask = 0;

    // We do this immediately as otherwise there is a race to set
    // ipv4_start_node.node_value and ipv4_start_node.netmask.
    if (mmdb->metadata.ip_version == 6) {
        status = find_ipv4_start_node(mmdb);
        if (status != MMDB_SUCCESS) {
            goto cleanup;
        }
    }

cleanup:
    if (MMDB_SUCCESS != status) {
        int saved_errno = errno;
        free_mmdb_struct(mmdb);
        errno = saved_errno;
    }
    return status;
}